

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringEq *curr)

{
  array<wasm::Literal,_1UL> *this_00;
  undefined1 auVar1 [8];
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 local_140 [8];
  Literal right;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_120;
  size_t local_108;
  char *pcStack_100;
  anon_union_16_6_1532cd5a_for_Literal_0 local_f8;
  undefined8 local_e8;
  undefined1 local_e0 [8];
  Literal left;
  undefined1 auStack_b8 [8];
  shared_ptr<wasm::GCData> leftData;
  Flow local_90;
  long local_48;
  shared_ptr<wasm::GCData> rightData;
  
  visit(&local_90,this,curr->left);
  if (local_90.breakTo.super_IString.str._M_str == (char *)0x0) {
    if (((long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) {
LAB_001c7504:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    this_00 = &local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed;
    ::wasm::Literal::Literal((Literal *)local_e0,this_00->_M_elems);
    visit((Flow *)local_140,this,curr->right);
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = (size_t)local_140;
    ::wasm::Literal::operator=(this_00->_M_elems,&right);
    leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_b8 = (undefined1  [8])
                 local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_120.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_120.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_120.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_120.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_120.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_120.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_b8);
    local_90.breakTo.super_IString.str._M_len = local_108;
    local_90.breakTo.super_IString.str._M_str = pcStack_100;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_120);
    ::wasm::Literal::~Literal(&right);
    if (local_90.breakTo.super_IString.str._M_str == (char *)0x0) {
      if (((long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) goto LAB_001c7504;
      ::wasm::Literal::Literal
                ((Literal *)local_140,
                 local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
      ::wasm::Literal::getGCData();
      ::wasm::Literal::getGCData();
      if (curr->op == StringEqEqual) {
        bVar5 = local_48 == 0 && auStack_b8 == (undefined1  [8])0x0;
        if (auStack_b8 != (undefined1  [8])0x0) {
          if (local_48 == 0) {
            bVar5 = false;
          }
          else {
            bVar5 = SmallVector<wasm::Literal,_1UL>::operator==
                              ((SmallVector<wasm::Literal,_1UL> *)
                               &(((anon_union_16_6_1532cd5a_for_Literal_0 *)auStack_b8)->func).
                                super_IString.str._M_str,
                               (SmallVector<wasm::Literal,_1UL> *)(local_48 + 8));
          }
        }
        rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = (uint)bVar5;
      }
      else {
        if (curr->op != StringEqCompare) {
          ::wasm::handle_unreachable
                    ("bad op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x8fd);
        }
        if ((auStack_b8 == (undefined1  [8])0x0) || (local_48 == 0)) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        auVar1 = auStack_b8;
        left.type.id = (long)auStack_b8 + 0x10;
        uVar4 = 0;
        do {
          if (((long)((long)(((pointer)((long)auVar1 + 0x30))->field_0).gcData.
                            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                     (((pointer)((long)auVar1 + 0x18))->type).id) >> 3) * -0x5555555555555555 +
              (long)(((anon_union_16_6_1532cd5a_for_Literal_0 *)auVar1)->gcData).
                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              == uVar4) {
            rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._4_4_ = -(uint)((*(long *)(local_48 + 0x30) - *(long *)(local_48 + 0x28) >> 3) *
                             -0x5555555555555555 + *(long *)(local_48 + 8) != uVar4);
            break;
          }
          if ((*(long *)(local_48 + 0x30) - *(long *)(local_48 + 0x28) >> 3) * -0x5555555555555555 +
              *(long *)(local_48 + 8) == uVar4) {
            rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._4_4_ = 1;
            break;
          }
          lVar2 = ::wasm::Literal::getInteger();
          lVar3 = ::wasm::Literal::getInteger();
          if (lVar2 < lVar3) {
            rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._4_4_ = 0xffffffff;
            bVar5 = false;
          }
          else if (lVar3 < lVar2) {
            rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._4_4_ = 1;
            bVar5 = false;
          }
          else {
            uVar4 = (ulong)((int)uVar4 + 1);
            bVar5 = true;
          }
        } while (bVar5);
      }
      local_f8.i32 = rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_;
      local_e8 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)&local_f8.func);
      ::wasm::Literal::~Literal((Literal *)&local_f8.func);
      if (rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      ::wasm::Literal::~Literal((Literal *)local_140);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      ::wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           local_90.breakTo.super_IString.str._M_len;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           local_90.breakTo.super_IString.str._M_str;
    }
    ::wasm::Literal::~Literal((Literal *)local_e0);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         local_90.breakTo.super_IString.str._M_len;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         local_90.breakTo.super_IString.str._M_str;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            (&local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
  ::wasm::Literal::~Literal(local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEq(StringEq* curr) {
    NOTE_ENTER("StringEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    int32_t result;
    switch (curr->op) {
      case StringEqEqual: {
        // They are equal if both are null, or both are non-null and equal.
        result =
          (!leftData && !rightData) ||
          (leftData && rightData && leftData->values == rightData->values);
        break;
      }
      case StringEqCompare: {
        if (!leftData || !rightData) {
          trap("null ref");
        }
        auto& leftValues = leftData->values;
        auto& rightValues = rightData->values;
        Index i = 0;
        while (1) {
          if (i == leftValues.size() && i == rightValues.size()) {
            // We reached the end, and they are equal.
            result = 0;
            break;
          } else if (i == leftValues.size()) {
            // The left string is short.
            result = -1;
            break;
          } else if (i == rightValues.size()) {
            result = 1;
            break;
          }
          auto left = leftValues[i].getInteger();
          auto right = rightValues[i].getInteger();
          if (left < right) {
            // The left character is lower.
            result = -1;
            break;
          } else if (left > right) {
            result = 1;
            break;
          } else {
            // Look further.
            i++;
          }
        }
        break;
      }
      default: {
        WASM_UNREACHABLE("bad op");
      }
    }
    return Literal(result);
  }